

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

StringRef __thiscall
Catch::Capturer::Capturer::anon_class_8_1_a855c668::operator()
          (anon_class_8_1_a855c668 *this,size_t start,size_t end)

{
  ulong uVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  StringRef SVar8;
  
  do {
    cVar2 = StringRef::operator[](this->names,start);
    if (cVar2 != ',') {
      bVar3 = StringRef::operator[](this->names,start);
      iVar4 = isspace((uint)bVar3);
      if (iVar4 == 0) {
        uVar7 = (end + 1) - start;
        do {
          cVar2 = StringRef::operator[](this->names,end);
          if (cVar2 != ',') {
            bVar3 = StringRef::operator[](this->names,end);
            iVar4 = isspace((uint)bVar3);
            if (iVar4 == 0) {
              uVar1 = this->names->m_size;
              uVar6 = uVar1 - start;
              pcVar5 = "";
              if (start <= uVar1 && uVar6 != 0) {
                pcVar5 = this->names->m_start + start;
              }
              if (uVar7 <= uVar6) {
                uVar6 = uVar7;
              }
              uVar7 = 0;
              if (start < uVar1) {
                uVar7 = uVar6;
              }
              SVar8.m_size = uVar7;
              SVar8.m_start = pcVar5;
              return SVar8;
            }
          }
          end = end - 1;
          uVar7 = uVar7 - 1;
        } while( true );
      }
    }
    start = start + 1;
  } while( true );
}

Assistant:

Capturer::Capturer( StringRef macroName, SourceLineInfo const& lineInfo, ResultWas::OfType resultType, StringRef names ) {
        auto trimmed = [&] (size_t start, size_t end) {
            while (names[start] == ',' || isspace(static_cast<unsigned char>(names[start]))) {
                ++start;
            }
            while (names[end] == ',' || isspace(static_cast<unsigned char>(names[end]))) {
                --end;
            }
            return names.substr(start, end - start + 1);
        };
        auto skipq = [&] (size_t start, char quote) {
            for (auto i = start + 1; i < names.size() ; ++i) {
                if (names[i] == quote)
                    return i;
                if (names[i] == '\\')
                    ++i;
            }
            CATCH_INTERNAL_ERROR("CAPTURE parsing encountered unmatched quote");
        };

        size_t start = 0;
        std::stack<char> openings;
        for (size_t pos = 0; pos < names.size(); ++pos) {
            char c = names[pos];
            switch (c) {
            case '[':
            case '{':
            case '(':
            // It is basically impossible to disambiguate between
            // comparison and start of template args in this context
//            case '<':
                openings.push(c);
                break;
            case ']':
            case '}':
            case ')':
//           case '>':
                openings.pop();
                break;
            case '"':
            case '\'':
                pos = skipq(pos, c);
                break;
            case ',':
                if (start != pos && openings.empty()) {
                    m_messages.emplace_back(macroName, lineInfo, resultType);
                    m_messages.back().message = static_cast<std::string>(trimmed(start, pos));
                    m_messages.back().message += " := ";
                    start = pos;
                }
            }
        }
        assert(openings.empty() && "Mismatched openings");
        m_messages.emplace_back(macroName, lineInfo, resultType);
        m_messages.back().message = static_cast<std::string>(trimmed(start, names.size() - 1));
        m_messages.back().message += " := ";
    }